

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

int ghc::filesystem::remove(char *__filename)

{
  uint code;
  int iVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  uint local_50 [2];
  error_category *local_48;
  string local_40;
  
  local_50[0] = 0;
  local_48 = (error_category *)std::_V2::system_category();
  iVar1 = remove((filesystem *)__filename,(char *)local_50);
  code = local_50[0];
  if (local_50[0] == 0) {
    return iVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_40,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_48;
  filesystem_error::filesystem_error(this,&local_40,(path *)__filename,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool remove(const path& p)
{
    std::error_code ec;
    auto result = remove(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}